

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_reader.h
# Opt level: O3

bool stl_reader::
     ReadStlFile_ASCII<lume::ArrayAnnex<float>,lume::ArrayAnnex<float>,lume::ArrayAnnex<unsigned_int>,lume::ArrayAnnex<unsigned_int>>
               (char *filename,ArrayAnnex<float> *coordsOut,ArrayAnnex<float> *normalsOut,
               ArrayAnnex<unsigned_int> *trisOut,ArrayAnnex<unsigned_int> *solidRangesOut)

{
  pointer pfVar1;
  pointer puVar2;
  iterator __position;
  double dVar3;
  pointer pbVar4;
  pointer pbVar5;
  vector<float,std::allocator<float>> *this;
  ulong uVar6;
  char cVar7;
  int iVar8;
  ostream *poVar9;
  runtime_error *prVar10;
  uint *puVar11;
  int iVar12;
  long lVar13;
  iterator iVar14;
  ulong __new_size;
  ulong uVar15;
  vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
  coordsWithIndex;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  string buffer;
  stringstream ss;
  istringstream line;
  ifstream in;
  vector<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
  local_5e8;
  long local_5c8;
  string local_5c0 [32];
  vector<unsigned_int,std::allocator<unsigned_int>> *local_5a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_598;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_580;
  ArrayAnnex<unsigned_int> *local_578;
  undefined1 *local_570;
  undefined8 local_568;
  undefined1 local_560;
  undefined7 uStack_55f;
  vector<float,std::allocator<float>> *local_550;
  ArrayAnnex<float> *local_548;
  CoordWithIndex<float,_unsigned_int> local_540;
  ostream local_530 [376];
  long local_3b8 [4];
  byte abStack_398 [88];
  ios_base local_340 [264];
  long local_238 [4];
  byte abStack_218 [488];
  
  pfVar1 = (coordsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((coordsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar1) {
    (coordsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar1;
  }
  pfVar1 = (normalsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((normalsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar1) {
    (normalsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar1;
  }
  puVar2 = (trisOut->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((trisOut->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (trisOut->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  puVar2 = (solidRangesOut->m_vector).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((solidRangesOut->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar2) {
    (solidRangesOut->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar2;
  }
  local_548 = coordsOut;
  std::ifstream::ifstream(local_238,filename,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_540);
    std::__ostream_insert<char,std::char_traits<char>>(local_530,"Couldn\'t open file ",0x13);
    std::operator<<(local_530,filename);
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar10,(string *)local_3b8);
    __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_580 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&solidRangesOut->m_vector;
  local_5e8.
  super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5e8.
  super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (CoordWithIndex<float,_unsigned_int> *)0x0;
  uVar15 = 0;
  local_5e8.
  super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (CoordWithIndex<float,_unsigned_int> *)0x0;
  local_570 = &local_560;
  local_568 = 0;
  local_560 = 0;
  local_598.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_598.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_598.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_578 = solidRangesOut;
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 7) == 0) {
    local_550 = (vector<float,std::allocator<float>> *)&normalsOut->m_vector;
    local_5a0 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&trisOut->m_vector;
    lVar13 = (long)local_238 + *(long *)(local_238[0] + -0x18);
    iVar12 = 1;
    local_5c8 = 0;
    do {
      cVar7 = std::ios::widen((char)lVar13);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_570,cVar7);
      std::__cxx11::istringstream::istringstream
                ((istringstream *)local_3b8,(string *)&local_570,_S_in);
      if ((abStack_398[*(long *)(local_3b8[0] + -0x18)] & 7) == 0) {
        lVar13 = 0;
        uVar6 = 1;
        do {
          __new_size = uVar6;
          if ((long)(int)uVar15 <= (long)(__new_size - 1)) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::resize(&local_598,__new_size);
            uVar15 = __new_size & 0xffffffff;
          }
          std::operator>>((istream *)local_3b8,
                          (string *)
                          ((long)&((local_598.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar13));
          pbVar4 = local_598.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar13 = lVar13 + 0x20;
          uVar6 = __new_size + 1;
        } while ((abStack_398[*(long *)(local_3b8[0] + -0x18)] & 7) == 0);
        iVar8 = std::__cxx11::string::compare
                          ((char *)local_598.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
        pbVar5 = local_598.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (iVar8 == 0) {
          if (__new_size - 1 < 3) {
            std::__cxx11::stringstream::stringstream((stringstream *)&local_540);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_530,"ERROR while reading from ",0x19);
            poVar9 = std::operator<<(local_530,filename);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,": vertex not specified correctly in line ",0x29);
            std::ostream::operator<<((ostream *)poVar9,iVar12);
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar10,local_5c0);
            __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          lVar13 = 0;
          do {
            dVar3 = atof((&pbVar5[1]._M_dataplus)[lVar13]._M_p);
            *(float *)((long)local_540.data + lVar13) = (float)dVar3;
            lVar13 = lVar13 + 4;
          } while (lVar13 != 0xc);
          local_540.index =
               (uint)((ulong)((long)local_5e8.
                                    super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_5e8.
                                   super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4);
          if (local_5e8.
              super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_5e8.
              super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<stl_reader::stl_reader_impl::CoordWithIndex<float,unsigned_int>,std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,unsigned_int>>>
            ::
            _M_realloc_insert<stl_reader::stl_reader_impl::CoordWithIndex<float,unsigned_int>const&>
                      ((vector<stl_reader::stl_reader_impl::CoordWithIndex<float,unsigned_int>,std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,unsigned_int>>>
                        *)&local_5e8,
                       (iterator)
                       local_5e8.
                       super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_540);
          }
          else {
            *(ulong *)(local_5e8.
                       super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->data =
                 CONCAT44(local_540.data[1],local_540.data[0]);
            *(ulong *)((local_5e8.
                        super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->data + 2) =
                 CONCAT44(local_540.index,local_540.data[2]);
            local_5e8.
            super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_5e8.
                 super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          local_5c8 = local_5c8 + 1;
        }
        else {
          iVar8 = std::__cxx11::string::compare((char *)pbVar4);
          if (iVar8 == 0) {
            if (__new_size - 1 < 4) {
              std::__cxx11::stringstream::stringstream((stringstream *)&local_540);
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_530,"ERROR while reading from ",0x19);
              poVar9 = std::operator<<(local_530,filename);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,": triangle not specified correctly in line ",0x2b);
              std::ostream::operator<<((ostream *)poVar9,iVar12);
              prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::stringbuf::str();
              std::runtime_error::runtime_error(prVar10,local_5c0);
              __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            iVar8 = std::__cxx11::string::compare
                              ((char *)(local_598.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 1));
            this = local_550;
            if (iVar8 != 0) {
              std::__cxx11::stringstream::stringstream((stringstream *)&local_540);
              std::__ostream_insert<char,std::char_traits<char>>
                        (local_530,"ERROR while reading from ",0x19);
              poVar9 = std::operator<<(local_530,filename);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,": Missing normal specifier in line ",0x23);
              std::ostream::operator<<((ostream *)poVar9,iVar12);
              prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::stringbuf::str();
              std::runtime_error::runtime_error(prVar10,local_5c0);
              __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            lVar13 = 0;
            do {
              dVar3 = atof(*(char **)((long)&local_598.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[2].
                                             _M_dataplus._M_p + lVar13));
              local_540.data[0] = (float)dVar3;
              __position._M_current =
                   (normalsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (normalsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          (this,__position,local_540.data);
              }
              else {
                *__position._M_current = local_540.data[0];
                (normalsOut->m_vector).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish = __position._M_current + 1;
              }
              lVar13 = lVar13 + 0x20;
            } while (lVar13 != 0x60);
            local_5c8 = 0;
          }
          else {
            iVar8 = std::__cxx11::string::compare((char *)pbVar4);
            if (iVar8 == 0) {
              if ((__new_size + 1 == 2) ||
                 (iVar8 = std::__cxx11::string::compare
                                    ((char *)(local_598.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start + 1)),
                 iVar8 != 0)) {
                std::__cxx11::stringstream::stringstream((stringstream *)&local_540);
                std::__ostream_insert<char,std::char_traits<char>>
                          (local_530,"ERROR while reading from ",0x19);
                poVar9 = std::operator<<(local_530,filename);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar9,": expecting outer loop in line ",0x1f);
                std::ostream::operator<<((ostream *)poVar9,iVar12);
                prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::stringbuf::str();
                std::runtime_error::runtime_error(prVar10,local_5c0);
                __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
            }
            else {
              iVar8 = std::__cxx11::string::compare((char *)pbVar4);
              if (iVar8 == 0) {
                if (local_5c8 != 3) {
                  std::__cxx11::stringstream::stringstream((stringstream *)&local_540);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (local_530,"ERROR while reading from ",0x19);
                  poVar9 = std::operator<<(local_530,filename);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar9,": bad number of vertices specified for face in line ",0x34);
                  std::ostream::operator<<((ostream *)poVar9,iVar12);
                  prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::__cxx11::stringbuf::str();
                  std::runtime_error::runtime_error(prVar10,local_5c0);
                  __cxa_throw(prVar10,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                iVar8 = (int)((ulong)((long)local_5e8.
                                            super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_5e8.
                                           super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 4);
                local_540.data[0] = (float)(iVar8 - 3);
                iVar14._M_current =
                     (trisOut->m_vector).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                puVar11 = (trisOut->m_vector).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
                if (iVar14._M_current == puVar11) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>(local_5a0,iVar14,(uint *)&local_540);
                  iVar14._M_current =
                       (trisOut->m_vector).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  puVar11 = (trisOut->m_vector).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage;
                  iVar8 = (int)((ulong)((long)local_5e8.
                                              super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_5e8.
                                             super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 4);
                }
                else {
                  *iVar14._M_current = (uint)local_540.data[0];
                  iVar14._M_current = iVar14._M_current + 1;
                  (trisOut->m_vector).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar14._M_current;
                }
                local_540.data[0] = (float)(iVar8 - 2);
                if (iVar14._M_current == puVar11) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>(local_5a0,iVar14,(uint *)&local_540);
                  iVar14._M_current =
                       (trisOut->m_vector).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  puVar11 = (trisOut->m_vector).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage;
                  iVar8 = (int)((ulong)((long)local_5e8.
                                              super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_5e8.
                                             super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 4);
                }
                else {
                  *iVar14._M_current = (uint)local_540.data[0];
                  iVar14._M_current = iVar14._M_current + 1;
                  (trisOut->m_vector).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar14._M_current;
                }
                local_540.data[0] = (float)(iVar8 - 1);
                if (iVar14._M_current == puVar11) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>(local_5a0,iVar14,(uint *)&local_540);
                }
                else {
                  *iVar14._M_current = (uint)local_540.data[0];
                  (trisOut->m_vector).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar14._M_current + 1;
                }
                local_5c8 = 3;
              }
              else {
                iVar8 = std::__cxx11::string::compare((char *)pbVar4);
                if (iVar8 == 0) {
                  local_540.data[0] =
                       (float)(((ulong)((long)(trisOut->m_vector).
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(trisOut->m_vector).
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 2 &
                               0xffffffff) / 3);
                  iVar14._M_current =
                       (local_578->m_vector).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (iVar14._M_current ==
                      (local_578->m_vector).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<unsigned_int,std::allocator<unsigned_int>>::
                    _M_realloc_insert<unsigned_int_const&>(local_580,iVar14,(uint *)&local_540);
                  }
                  else {
                    *iVar14._M_current = (uint)local_540.data[0];
                    (local_578->m_vector).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
                  }
                }
              }
            }
          }
        }
      }
      iVar12 = iVar12 + 1;
      std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
      std::ios_base::~ios_base(local_340);
      lVar13 = (long)local_238 + *(long *)(local_238[0] + -0x18);
    } while ((abStack_218[*(long *)(local_238[0] + -0x18)] & 7) == 0);
  }
  local_540.data[0] =
       (float)(((ulong)((long)(trisOut->m_vector).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(trisOut->m_vector).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 2 & 0xffffffff) / 3);
  iVar14._M_current =
       (local_578->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (iVar14._M_current ==
      (local_578->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              (local_580,iVar14,(uint *)&local_540);
  }
  else {
    *iVar14._M_current = (uint)local_540.data[0];
    (local_578->m_vector).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar14._M_current + 1;
  }
  stl_reader_impl::RemoveDoubles<lume::ArrayAnnex<float>,lume::ArrayAnnex<unsigned_int>>
            (local_548,trisOut,&local_5e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_598);
  if (local_570 != &local_560) {
    operator_delete(local_570,CONCAT71(uStack_55f,local_560) + 1);
  }
  if (local_5e8.
      super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5e8.
                    super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_5e8.
                          super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_5e8.
                          super__Vector_base<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>,_std::allocator<stl_reader::stl_reader_impl::CoordWithIndex<float,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::ifstream::~ifstream(local_238);
  return true;
}

Assistant:

bool ReadStlFile_ASCII(const char* filename,
                       TNumberContainer1& coordsOut,
                       TNumberContainer2& normalsOut,
                       TIndexContainer1& trisOut,
					   TIndexContainer2& solidRangesOut)
{
	using namespace std;
	using namespace stl_reader_impl;

	typedef typename TNumberContainer1::value_type	number_t;
	typedef typename TIndexContainer1::value_type	index_t;

	coordsOut.clear();
	normalsOut.clear();
	trisOut.clear();
	solidRangesOut.clear();

	ifstream in(filename);
	STL_READER_COND_THROW(!in, "Couldn't open file " << filename);

	vector<CoordWithIndex <number_t, index_t> > coordsWithIndex;

	string buffer;
	vector<string> tokens;
	int lineCount = 1;
	int maxNumTokens = 0;
	size_t numFaceVrts = 0;

	while(!(in.eof() || in.fail()))
	{
	//	read the line and tokenize.
	//	In order to reuse memory in between lines, 'tokens' won't be cleared.
	//	Instead we count the number of tokens using 'tokenCount'.
		getline(in, buffer);

		istringstream line(buffer);
		int tokenCount = 0;
		while(!(line.eof() || line.fail())){
			if(tokenCount >= maxNumTokens){
				maxNumTokens = tokenCount + 1;
				tokens.resize(maxNumTokens);
			}
			line >> tokens[tokenCount];
			++tokenCount;
		}

		if(tokenCount > 0)
		{
			string& tok = tokens[0];
			if(tok.compare("vertex") == 0){
				if(tokenCount < 4){
					STL_READER_THROW("ERROR while reading from " << filename <<
						": vertex not specified correctly in line " << lineCount);
				}
				
			//	read the position
				CoordWithIndex <number_t, index_t> c;
				for(size_t i = 0; i < 3; ++i)
					c[i] = static_cast<number_t> (atof(tokens[i+1].c_str()));
				c.index = static_cast<index_t>(coordsWithIndex.size());
				coordsWithIndex.push_back(c);
				++numFaceVrts;
			}
			else if(tok.compare("facet") == 0)
			{
				STL_READER_COND_THROW(tokenCount < 5,
						"ERROR while reading from " << filename <<
						": triangle not specified correctly in line " << lineCount);
				
				STL_READER_COND_THROW(tokens[1].compare("normal") != 0,
						"ERROR while reading from " << filename <<
						": Missing normal specifier in line " << lineCount);
				
			//	read the normal
				for(size_t i = 0; i < 3; ++i)
					normalsOut.push_back (static_cast<number_t> (atof(tokens[i+2].c_str())));

				numFaceVrts = 0;
			}
			else if(tok.compare("outer") == 0){
				STL_READER_COND_THROW ((tokenCount < 2) || (tokens[1].compare("loop") != 0),
				    "ERROR while reading from " << filename <<
					": expecting outer loop in line " << lineCount);
			}
			else if(tok.compare("endfacet") == 0){
				STL_READER_COND_THROW(numFaceVrts != 3,
					"ERROR while reading from " << filename <<
					": bad number of vertices specified for face in line " << lineCount);

				trisOut.push_back(static_cast<index_t> (coordsWithIndex.size() - 3));
				trisOut.push_back(static_cast<index_t> (coordsWithIndex.size() - 2));
				trisOut.push_back(static_cast<index_t> (coordsWithIndex.size() - 1));
			}
			else if(tok.compare("solid") == 0){
				solidRangesOut.push_back(static_cast<index_t> (trisOut.size() / 3));
			}
		}
		lineCount++;
	}

	solidRangesOut.push_back(static_cast<index_t> (trisOut.size() / 3));

	RemoveDoubles (coordsOut, trisOut, coordsWithIndex);

	return true;
}